

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

Result emulator_read_ext_ram(Emulator *e,FileData *file_data)

{
  FileData *file_data_local;
  Emulator *e_local;
  
  if ((e->state).ext_ram.battery_type == BATTERY_TYPE_WITH_BATTERY) {
    if (file_data->size == (e->state).ext_ram.size) {
      memcpy(&(e->state).ext_ram,file_data->data,file_data->size);
      e_local._4_4_ = OK;
    }
    else {
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",
              0x1366);
      fprintf(_stderr,"save file is wrong size: %ld, expected %ld.\n",file_data->size,
              (e->state).ext_ram.size);
      e_local._4_4_ = ERROR;
    }
  }
  else {
    e_local._4_4_ = OK;
  }
  return e_local._4_4_;
}

Assistant:

Result emulator_read_ext_ram(Emulator* e, const FileData* file_data) {
  if (EXT_RAM.battery_type != BATTERY_TYPE_WITH_BATTERY)
    return OK;

  CHECK_MSG(file_data->size == EXT_RAM.size,
            "save file is wrong size: %ld, expected %ld.\n",
            (long)file_data->size, (long)EXT_RAM.size);
  memcpy(EXT_RAM.data, file_data->data, file_data->size);
  return OK;
  ON_ERROR_RETURN;
}